

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  long lVar1;
  uint uVar2;
  Rep *pRVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  void **ppvVar7;
  
  sVar5 = (size_t)(this->method_).super_RepeatedPtrFieldBase.current_size_;
  pRVar3 = (this->method_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar1 = sVar5 * 8;
  for (lVar6 = 0; lVar1 - lVar6 != 0; lVar6 = lVar6 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::MethodDescriptorProto>
                      (*(MethodDescriptorProto **)((long)ppvVar7 + lVar6));
    sVar5 = sVar5 + sVar4;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      sVar4 = internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar5 = sVar5 + sVar4 + 1;
    }
    if ((uVar2 & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceOptions>
                        (this->options_);
      sVar5 = sVar5 + sVar4 + 1;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar5,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t ServiceDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  total_size += 1UL * this->_internal_method_size();
  for (const auto& msg : this->method_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}